

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O2

HighsStatus normaliseHessian(HighsOptions *options,HighsHessian *hessian)

{
  uint uVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  HighsInt iEl;
  int iVar9;
  size_type sVar10;
  ulong uVar11;
  HighsStatus HVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  HighsInt ix;
  int iVar17;
  ulong uVar18;
  size_type __n;
  double dVar19;
  double dVar20;
  double dVar21;
  size_type local_168;
  double local_158;
  double local_150;
  vector<double,_std::allocator<double>_> column_value;
  vector<int,_std::allocator<int>_> column_index;
  vector<int,_std::allocator<int>_> qr_length;
  HighsHessian normalised;
  HighsHessian transpose;
  value_type_conflict1 local_38;
  
  uVar1 = hessian->dim_;
  __n = (size_type)(int)uVar1;
  local_168 = (size_type)
              (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[__n];
  if ((long)local_168 < 1) {
    HVar12 = kOk;
  }
  else {
    HighsHessian::HighsHessian(&transpose);
    transpose.dim_ = uVar1;
    std::vector<int,_std::allocator<int>_>::resize(&transpose.start_,__n + 1);
    std::vector<int,_std::allocator<int>_>::resize(&transpose.index_,local_168);
    std::vector<double,_std::allocator<double>_>::resize(&transpose.value_,local_168);
    qr_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    qr_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    qr_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    normalised.dim_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&qr_length,__n,&normalised.dim_);
    piVar2 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (sVar10 = 0; local_168 != sVar10; sVar10 = sVar10 + 1) {
      qr_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar2[sVar10]] =
           qr_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar2[sVar10]] + 1;
    }
    *transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = 0;
    iVar9 = 0;
    uVar15 = 0;
    if (0 < (int)uVar1) {
      uVar15 = (ulong)uVar1;
    }
    for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
      iVar9 = iVar9 + qr_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14];
      transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar14 + 1] = iVar9;
    }
    piVar2 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    while (uVar11 = uVar14, uVar11 != uVar15) {
      piVar3 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar16 = (long)piVar2[uVar11]; uVar14 = uVar11 + 1, lVar16 < piVar2[uVar11 + 1];
          lVar16 = lVar16 + 1) {
        iVar9 = piVar3[lVar16];
        iVar17 = transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9];
        transpose.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar17] = (int)uVar11;
        transpose.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar17] = pdVar4[lVar16];
        transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar9] =
             transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar9] + 1;
      }
    }
    *transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = 0;
    iVar9 = 0;
    for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
      iVar9 = iVar9 + qr_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14];
      transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar14 + 1] = iVar9;
    }
    HighsHessian::HighsHessian(&normalised);
    normalised.format_ = kSquare;
    normalised.dim_ = uVar1;
    std::vector<int,_std::allocator<int>_>::resize(&normalised.start_,__n + 1);
    std::vector<int,_std::allocator<int>_>::resize(&normalised.index_,local_168);
    std::vector<double,_std::allocator<double>_>::resize(&normalised.value_,local_168);
    column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    column_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&column_index,__n);
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&column_value,__n,&local_38);
    *normalised.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
     ._M_start = 0;
    local_150 = INFINITY;
    iVar9 = 0;
    uVar13 = 0;
    local_158 = 0.0;
    uVar14 = 0;
    while (uVar14 != uVar15) {
      piVar2 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = (long)piVar2[uVar14];
      uVar11 = uVar14 + 1;
      piVar3 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar18 = 0; (long)(lVar16 + uVar18) < (long)piVar2[uVar11]; uVar18 = uVar18 + 1) {
        iVar17 = piVar3[lVar16 + uVar18];
        column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar17] = pdVar4[lVar16 + uVar18];
        column_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar18] = iVar17;
      }
      for (lVar16 = (long)transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar14]; iVar17 = (int)uVar18,
          lVar16 < transpose.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11]; lVar16 = lVar16 + 1) {
        iVar8 = transpose.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16];
        dVar20 = column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar8];
        dVar19 = transpose.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16];
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          dVar19 = dVar19 + dVar20;
        }
        else {
          column_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[iVar17] = iVar8;
          uVar18 = (ulong)(iVar17 + 1);
        }
        column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = dVar19;
      }
      uVar7 = iVar17 + iVar9;
      iVar8 = (int)local_168;
      if (iVar8 < (int)uVar7) {
        uVar5 = iVar8 * 2;
        if (uVar7 != uVar5 && SBORROW4(uVar7,uVar5) == (int)(uVar7 + iVar8 * -2) < 0) {
          uVar5 = uVar7;
        }
        local_168 = (size_type)uVar5;
        std::vector<int,_std::allocator<int>_>::resize(&normalised.index_,(long)(int)uVar5);
        std::vector<double,_std::allocator<double>_>::resize(&normalised.value_,(long)(int)uVar5);
      }
      uVar14 = 0;
      if (0 < iVar17) {
        uVar14 = uVar18 & 0xffffffff;
      }
      for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
        dVar20 = column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [column_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar18]] * 0.5;
        if (dVar20 == 0.0) {
          dVar19 = ABS(dVar20);
          dVar21 = dVar19;
          if (dVar19 <= local_158) {
            dVar21 = local_158;
          }
          if (local_150 <= dVar19) {
            dVar19 = local_150;
          }
          uVar13 = uVar13 + 1;
          dVar20 = 0.0;
          local_158 = dVar21;
          local_150 = dVar19;
        }
        column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start
        [column_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar18]] = dVar20;
      }
      bVar6 = 0.1 <= (double)iVar17 / (double)(int)uVar1;
      uVar18 = uVar15;
      if (!bVar6 && (int)uVar1 >= 0xb) {
        sortSetData(iVar17,&column_index,(HighsVarType *)0x0,(HighsVarType *)0x0);
        uVar18 = uVar14;
      }
      for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
        if (bVar6 || (int)uVar1 < 0xb) {
          iVar17 = (int)uVar14;
        }
        else {
          iVar17 = column_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
        }
        dVar20 = column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar17];
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          normalised.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar9] = iVar17;
          normalised.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar9] = dVar20;
          iVar9 = iVar9 + 1;
          column_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar17] = 0.0;
        }
      }
      normalised.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] = iVar9;
      uVar14 = uVar11;
    }
    if (uVar13 != 0) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                   "Normalised Hessian contains %d |values| in [%g, %g] less than %g: ignored\n",
                   local_150,local_158,0,(ulong)uVar13);
    }
    HighsHessian::operator=(hessian,&normalised);
    HVar12 = (HighsStatus)(uVar13 != 0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&column_index.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&column_value.super__Vector_base<double,_std::allocator<double>_>);
    HighsHessian::~HighsHessian(&normalised);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&qr_length.super__Vector_base<int,_std::allocator<int>_>);
    HighsHessian::~HighsHessian(&transpose);
  }
  return HVar12;
}

Assistant:

HighsStatus normaliseHessian(const HighsOptions& options,
                             HighsHessian& hessian) {
  // Only relevant for a Hessian with format HessianFormat::kSquare
  assert(hessian.format_ == HessianFormat::kSquare);
  // Normalise the Hessian to be (Q + Q^T)/2, where Q is the matrix
  // supplied. This guarantees that what's used internally is
  // symmetric.
  //
  // So someone preferring to supply only the upper triangle would
  // have to double its values..
  HighsStatus return_status = HighsStatus::kOk;
  const HighsInt dim = hessian.dim_;
  const HighsInt hessian_num_nz = hessian.start_[dim];
  if (hessian_num_nz <= 0) return HighsStatus::kOk;
  bool warning_found = false;

  HighsHessian transpose;
  transpose.dim_ = dim;
  transpose.start_.resize(dim + 1);
  transpose.index_.resize(hessian_num_nz);
  transpose.value_.resize(hessian_num_nz);
  // Form transpose of Hessian
  vector<HighsInt> qr_length;
  qr_length.assign(dim, 0);
  for (HighsInt iEl = 0; iEl < hessian_num_nz; iEl++)
    qr_length[hessian.index_[iEl]]++;

  transpose.start_[0] = 0;
  for (HighsInt iRow = 0; iRow < dim; iRow++)
    transpose.start_[iRow + 1] = transpose.start_[iRow] + qr_length[iRow];
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      HighsInt iRowEl = transpose.start_[iRow];
      transpose.index_[iRowEl] = iCol;
      transpose.value_[iRowEl] = hessian.value_[iEl];
      transpose.start_[iRow]++;
    }
  }

  transpose.start_[0] = 0;
  for (HighsInt iRow = 0; iRow < dim; iRow++)
    transpose.start_[iRow + 1] = transpose.start_[iRow] + qr_length[iRow];
  // Instantiate a square format Hessian in which to accumulate (Q + Q^T)/2
  HighsHessian normalised;
  normalised.format_ = HessianFormat::kSquare;
  HighsInt normalised_num_nz = 0;
  HighsInt normalised_size = hessian_num_nz;
  normalised.dim_ = dim;
  normalised.start_.resize(dim + 1);
  normalised.index_.resize(normalised_size);
  normalised.value_.resize(normalised_size);
  vector<double> column_value;
  vector<HighsInt> column_index;
  column_index.resize(dim);
  column_value.assign(dim, 0.0);
  const bool check_column_value_zero = false;
  const double small_matrix_value = 0;
  HighsInt num_small_values = 0;
  double max_small_value = 0;
  double min_small_value = kHighsInf;
  normalised.start_[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt column_num_nz = 0;
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      column_value[iRow] = hessian.value_[iEl];
      column_index[column_num_nz] = iRow;
      column_num_nz++;
    }
    for (HighsInt iEl = transpose.start_[iCol];
         iEl < transpose.start_[iCol + 1]; iEl++) {
      HighsInt iRow = transpose.index_[iEl];
      if (column_value[iRow]) {
        column_value[iRow] += transpose.value_[iEl];
      } else {
        column_value[iRow] = transpose.value_[iEl];
        column_index[column_num_nz] = iRow;
        column_num_nz++;
      }
    }
    if (normalised_num_nz + column_num_nz > normalised_size) {
      normalised_size =
          std::max(normalised_num_nz + column_num_nz, 2 * normalised_size);
      normalised.index_.resize(normalised_size);
      normalised.value_.resize(normalised_size);
    }
    // Halve the values, zeroing and accounting for any small ones
    for (HighsInt ix = 0; ix < column_num_nz; ix++) {
      HighsInt iRow = column_index[ix];
      double value = 0.5 * column_value[iRow];
      double abs_value = std::fabs(value);
      bool ok_value = abs_value > small_matrix_value;
      if (!ok_value) {
        value = 0;
        if (max_small_value < abs_value) max_small_value = abs_value;
        if (min_small_value > abs_value) min_small_value = abs_value;
        num_small_values++;
      }
      column_value[iRow] = value;
    }
    // Decide whether to exploit sparsity in extracting the indices
    // and values of nonzeros
    const HighsInt kDimTolerance = 10;
    const double kDensityTolerance = 0.1;
    const double density = (1.0 * column_num_nz) / (1.0 * dim);
    HighsInt to_ix = dim;
    const bool exploit_sparsity =
        dim > kDimTolerance && density < kDensityTolerance;
    if (exploit_sparsity) {
      // Exploit sparsity
      to_ix = column_num_nz;
      sortSetData(column_num_nz, column_index, NULL, NULL);
    } else {
      to_ix = dim;
    }
    for (HighsInt ix = 0; ix < to_ix; ix++) {
      HighsInt iRow;
      if (exploit_sparsity) {
        iRow = column_index[ix];
      } else {
        iRow = ix;
      }
      double value = column_value[iRow];
      if (value) {
        normalised.index_[normalised_num_nz] = iRow;
        normalised.value_[normalised_num_nz] = value;
        normalised_num_nz++;
        column_value[iRow] = 0;
      }
    }
    if (check_column_value_zero) {
      for (HighsInt iRow = 0; iRow < dim; iRow++)
        assert(column_value[iRow] == 0);
    }
    normalised.start_[iCol + 1] = normalised_num_nz;
  }
  if (num_small_values) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Normalised Hessian contains %" HIGHSINT_FORMAT
                 " |values| in [%g, %g] "
                 "less than %g: ignored\n",
                 num_small_values, min_small_value, max_small_value,
                 small_matrix_value);
    warning_found = true;
  }
  // Replace the Hessian by the normalised form
  hessian = normalised;
  assert(hessian.format_ == HessianFormat::kSquare);
  if (warning_found)
    return_status = HighsStatus::kWarning;
  else
    return_status = HighsStatus::kOk;

  return return_status;
}